

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void eig(double *A,int N,double *eigre,double *eigim)

{
  double *pdVar1;
  double dVar2;
  double *H;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  lVar4 = (long)N;
  H = (double *)malloc(lVar4 * lVar4 * 8);
  iVar5 = N + -1;
  francis_iter(A,N,H);
  iVar6 = 0;
  while (iVar3 = iVar6, iVar3 < iVar5) {
    if ((H[(iVar3 + 1) * N + iVar3] != 0.0) || (iVar6 = iVar3 + 1, NAN(H[(iVar3 + 1) * N + iVar3])))
    {
      pdVar1 = H + (long)(iVar3 * N) + (long)iVar3;
      dVar11 = *pdVar1;
      dVar8 = pdVar1[1];
      dVar9 = pdVar1[lVar4];
      dVar2 = pdVar1[lVar4 + 1];
      dVar10 = dVar8 + dVar9;
      dVar12 = 0.7071067811865475;
      dVar13 = 0.7071067811865475;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar12 = (dVar11 - dVar2) / dVar10;
        dVar12 = dVar12 / (SQRT(dVar12 * dVar12 + 1.0) + 1.0);
        dVar13 = 1.0 / SQRT(dVar12 * dVar12 + 1.0);
        dVar12 = dVar12 * dVar13;
      }
      dVar15 = dVar12 * dVar12;
      dVar14 = dVar13 * dVar13;
      dVar10 = dVar10 * dVar12 * dVar13;
      dVar12 = dVar12 * dVar13 * (dVar11 - dVar2);
      *pdVar1 = (dVar14 * dVar11 + dVar2 * dVar15) - dVar10;
      pdVar1[1] = (dVar14 * dVar8 - dVar9 * dVar15) + dVar12;
      pdVar1[lVar4] = (dVar14 * dVar9 - dVar8 * dVar15) + dVar12;
      pdVar1[lVar4 + 1] = dVar14 * dVar2 + dVar15 * dVar11 + dVar10;
      iVar6 = iVar3 + 2;
    }
  }
  iVar6 = 0;
  while( true ) {
    if (iVar5 <= iVar6) break;
    iVar3 = iVar6 + 1;
    lVar4 = (long)(iVar3 * N + iVar6);
    dVar11 = H[lVar4];
    lVar7 = (long)(iVar6 * (N + 1));
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar8 = H[lVar7 + 1];
      if (0.0 <= dVar11 * dVar8) {
        dVar9 = 0.0;
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar9 = dVar11 / dVar8;
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          dVar9 = dVar9 / (dVar9 * dVar9 + 1.0);
        }
        dVar10 = 0.0;
        dVar2 = H[lVar7];
        dVar9 = (dVar11 + dVar8) * dVar9;
        eigre[iVar6] = dVar2 - dVar9;
        eigre[iVar3] = dVar9 + dVar2;
        eigim[iVar6] = 0.0;
      }
      else {
        eigre[iVar6] = H[lVar7];
        eigre[iVar3] = H[lVar4 + 1];
        dVar11 = dVar11 * -dVar8;
        dVar10 = SQRT(dVar11);
        dVar8 = dVar10;
        if (dVar11 < 0.0) {
          dVar8 = sqrt(dVar11);
        }
        eigim[iVar6] = dVar8;
        if (dVar11 < 0.0) {
          dVar10 = sqrt(dVar11);
        }
        dVar10 = -dVar10;
      }
      eigim[iVar3] = dVar10;
      iVar6 = iVar6 + 2;
    }
    else {
      eigre[iVar6] = H[lVar7];
      eigim[iVar6] = 0.0;
      iVar6 = iVar3;
    }
  }
  if (iVar6 == iVar5) {
    eigre[iVar5] = H[(ulong)(uint)(N * N) - 1];
    eigim[iVar5] = 0.0;
  }
  free(H);
  return;
}

Assistant:

void eig(double *A,int N,double *eigre,double *eigim) {
	int i,t,u,n;
	double *H;
	double t1,t2,cs;
	H = (double*) malloc(sizeof(double) * N * N);
	n = N - 1;
	francis_iter(A,N,H);
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		if (H[t+i] != 0.) {
			eig2t(H+u+i,N);
			i = i +2;
		} else {
			i++;
		}
		
	}
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		
		if (H[t+i] != 0.) {
			if (H[u+i+1] * H[t+i] < 0.) {
				eigre[i] = H[u+i];
				eigre[i+1] = H[t+i+1];
				eigim[i] = sqrt(-H[u+i+1] * H[t+i]);
				eigim[i+1] = -sqrt(-H[u+i+1] * H[t+i]);
			} else {
				if (H[u+i+1] == 0.) {
					cs = 0.;
				} else {
					t1 = sqrt(H[t+i]/H[u+i+1]);
					t2 = t1 * t1;
					cs = t1/(1+t2);
				}
				eigre[i] = H[u+i] - cs * (H[u+i+1] + H[t+i]);
				eigre[i+1] = H[u+i] + cs * (H[u+i+1] + H[t+i]);
				eigim[i] = 0.;
				eigim[i+1] = 0.;
				
			}
			
			i= i + 2;
			
		} else {
			eigre[i] = H[u+i];
			eigim[i] = 0.;
			i++;
		}
		
	}
	
	if (i == n) {
		eigre[i] = H[N*N - 1];
		eigim[i] = 0.;
	}
	
	free(H);
}